

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv6Transmitter::SetMaximumPacketSize(RTPUDPv6Transmitter *this,size_t s)

{
  int iVar1;
  
  iVar1 = -0x72;
  if (((this->init == true) && (iVar1 = -0x71, this->created == true)) &&
     (iVar1 = -0x75, s < 0x10000)) {
    this->maxpacksize = s;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::SetMaximumPacketSize(size_t s)	
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (s > RTPUDPV6TRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_SPECIFIEDSIZETOOBIG;
	}
	maxpacksize = s;
	MAINMUTEX_UNLOCK
	return 0;
}